

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> * __thiscall
slang::ast::Compilation::getDefinitions
          (vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
           *__return_storage_ptr__,Compilation *this)

{
  pointer ppSVar1;
  Symbol *pSVar2;
  const_iterator __position;
  uint uVar3;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  ulong uVar4;
  _Cat _Var5;
  char_pointer puVar6;
  uint uVar7;
  table_element_pointer ppVar8;
  pointer ppSVar9;
  char_pointer puVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  iterator iVar13;
  Symbol *sym;
  char_pointer local_48;
  Symbol *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar13 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
           ::begin(&(this->definitionMap).table_);
LAB_002e3d99:
  do {
    ppVar8 = iVar13.p_;
    if (ppVar8 == (table_element_pointer)0x0) {
      return __return_storage_ptr__;
    }
    ppSVar9 = (ppVar8->second).first.
              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar1 = (ppVar8->second).first.
              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_48 = iVar13.pc_;
    for (; ppSVar9 != ppSVar1; ppSVar9 = ppSVar9 + 1) {
      pSVar2 = *ppSVar9;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_38 = pSVar2;
      uVar11 = (long)(__return_storage_ptr__->
                     super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 3;
      while (uVar4 = uVar11, 0 < (long)uVar4) {
        uVar11 = uVar4 >> 1;
        __y._M_len = (__position._M_current[uVar11]->name)._M_len;
        __y._M_str = (__position._M_current[uVar11]->name)._M_str;
        __x._M_len = (pSVar2->name)._M_len;
        __x._M_str = (pSVar2->name)._M_str;
        _Var5 = std::operator<=><char,std::char_traits<char>>(__x,__y);
        if (-1 < _Var5._M_value) {
          __position._M_current = __position._M_current + uVar11 + 1;
          uVar11 = ~uVar11 + uVar4;
        }
      }
      std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::insert
                (__return_storage_ptr__,__position,&local_38);
    }
    puVar10 = local_48 + 2;
    do {
      puVar6 = puVar10;
      puVar10 = iVar13.pc_;
      ppVar8 = iVar13.p_ + 1;
      if (((uint)iVar13.pc_ & 0xf) == 0xe) goto LAB_002e3e74;
      iVar13.p_ = ppVar8;
      iVar13.pc_ = puVar10 + 1;
      puVar10 = puVar6 + 1;
    } while (puVar6[-1] == '\0');
    iVar13.pc_ = puVar6 + -1;
    if (puVar6[-1] == '\x01') {
      iVar13.p_ = (table_element_pointer)0x0;
    }
  } while( true );
LAB_002e3e74:
  do {
    auVar12[0] = -(*puVar6 == '\0');
    auVar12[1] = -(puVar6[1] == '\0');
    auVar12[2] = -(puVar6[2] == '\0');
    auVar12[3] = -(puVar6[3] == '\0');
    auVar12[4] = -(puVar6[4] == '\0');
    auVar12[5] = -(puVar6[5] == '\0');
    auVar12[6] = -(puVar6[6] == '\0');
    auVar12[7] = -(puVar6[7] == '\0');
    auVar12[8] = -(puVar6[8] == '\0');
    auVar12[9] = -(puVar6[9] == '\0');
    auVar12[10] = -(puVar6[10] == '\0');
    auVar12[0xb] = -(puVar6[0xb] == '\0');
    auVar12[0xc] = -(puVar6[0xc] == '\0');
    auVar12[0xd] = -(puVar6[0xd] == '\0');
    auVar12[0xe] = -(puVar6[0xe] == '\0');
    auVar12[0xf] = -(puVar6[0xf] == '\0');
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe);
    if (uVar7 == 0x7fff) {
      puVar6 = puVar6 + 0x10;
      ppVar8 = ppVar8 + 0xf;
    }
    else {
      uVar3 = 0;
      if ((uVar7 ^ 0x7fff) != 0) {
        for (; ((uVar7 ^ 0x7fff) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if (puVar6[uVar3] == '\x01') {
        ppVar8 = (table_element_pointer)0x0;
      }
      else {
        puVar6 = puVar6 + uVar3;
        ppVar8 = ppVar8 + uVar3;
      }
    }
    iVar13.p_ = ppVar8;
    iVar13.pc_ = puVar6;
  } while (uVar7 == 0x7fff);
  goto LAB_002e3d99;
}

Assistant:

std::vector<const Symbol*> Compilation::getDefinitions() const {
    std::vector<const Symbol*> result;
    for (auto& [key, val] : definitionMap) {
        for (auto sym : val.first) {
            result.insert(std::ranges::upper_bound(result, sym->name, {},
                                                   [](auto item) { return item->name; }),
                          sym);
        }
    }

    return result;
}